

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O0

void __thiscall cmRST::ProcessDirectiveReplace(cmRST *this)

{
  string_view local_58;
  string_view local_48;
  string local_38;
  mapped_type *local_18;
  string *replacement;
  cmRST *this_local;
  
  replacement = (string *)this;
  local_18 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->Replace,&this->ReplaceName);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48," ");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58);
  cmJoin(&local_38,&this->MarkupLines,local_48,local_58);
  std::__cxx11::string::operator+=((string *)local_18,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::clear();
  return;
}

Assistant:

void cmRST::ProcessDirectiveReplace()
{
  // Record markup lines as replacement text.
  std::string& replacement = this->Replace[this->ReplaceName];
  replacement += cmJoin(this->MarkupLines, " ");
  this->ReplaceName.clear();
}